

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O3

MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::createPipeline
          (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *__return_storage_ptr__,SeparateShaderTest *this,ProgramParams *pp)

{
  ostringstream *poVar1;
  RenderContext *renderCtx;
  undefined8 uVar2;
  bool condition;
  bool bVar3;
  deUint32 dVar4;
  deUint32 seed;
  ulong uVar5;
  ProgramPipeline *pPVar6;
  Pipeline *pPVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  char *pcVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  MovePtr<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> pipeline;
  string vtxSource;
  string vtxName;
  string frgName;
  string frgSource;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> local_268;
  string local_258;
  string local_238;
  string local_218;
  VaryingInterface *local_1f8;
  vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *local_1f0;
  MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  *local_1e8;
  string local_1e0;
  undefined1 local_1c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [6];
  ios_base local_148 [264];
  UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_> local_40;
  
  bVar3 = (this->m_params).useUniform;
  uVar5 = (ulong)(this->m_params).useSameName;
  pcVar10 = "vtxScale";
  if (uVar5 != 0) {
    pcVar10 = "scale";
  }
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_1e8 = __return_storage_ptr__;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_238,pcVar10,pcVar10 + (uVar5 ^ 1) * 3 + 5);
  if ((this->m_params).switchVtx == true) {
    dVar4 = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  else {
    dVar4 = pp->vtxSeed;
  }
  uVar5 = (ulong)(this->m_params).useSameName;
  pcVar10 = "frgScale";
  if (uVar5 != 0) {
    pcVar10 = "scale";
  }
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_218,pcVar10,pcVar10 + (uVar5 ^ 1) * 3 + 5);
  if ((this->m_params).switchFrg == true) {
    seed = deRandom_getUint32(&(this->m_rnd).m_rnd);
  }
  else {
    seed = pp->frgSeed;
  }
  local_1f0 = &(this->m_varyings).frgInputs;
  genFrgShaderSrc(&local_1e0,seed,local_1f0,&local_218,bVar3,pp->frgScale);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  pPVar6 = (ProgramPipeline *)operator_new(0x10);
  glu::ProgramPipeline::ProgramPipeline(pPVar6,renderCtx);
  local_1f8 = &this->m_varyings;
  local_268.m_data.ptr = pPVar6;
  if ((this->m_params).initSingle == true) {
    varyingCompatVtxOutputs
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               local_1c0,local_1f8);
    genVtxShaderSrc(&local_258,dVar4,
                    (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
                    local_1c0,&local_238,bVar3,pp->vtxScale);
    std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::~vector
              ((vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *)
               local_1c0);
    createShaderProgram((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                         *)local_1c0,this,&local_258,&local_1e0,true);
    uVar2 = local_1c0._0_8_;
    pPVar6 = local_268.m_data.ptr;
    local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c0._0_8_;
    dVar4 = (**(code **)(*(size_type *)local_1c0._0_8_ + 0x10))();
    glu::ProgramPipeline::useProgramStages(pPVar6,3,dVar4);
    local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created pipeline ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," with two-shader program ",0x19);
    (**(code **)(*(size_type *)uVar2 + 0x10))();
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    genVtxShaderSrc(&local_258,dVar4,&local_1f8->vtxOutputs,&local_238,bVar3,pp->vtxScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1c0,this,SHADERTYPE_VERTEX,&local_258);
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_1c0._0_8_;
    pPVar6 = local_268.m_data.ptr;
    dVar4 = (**(code **)(*(size_type *)local_1c0._0_8_ + 0x10))(local_1c0._0_8_);
    glu::ProgramPipeline::useProgramStages(pPVar6,1,dVar4);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1c0,this,SHADERTYPE_FRAGMENT,&local_1e0);
    paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c0._0_8_;
    pPVar6 = local_268.m_data.ptr;
    dVar4 = (**(code **)(*(size_type *)local_1c0._0_8_ + 0x10))(local_1c0._0_8_);
    glu::ProgramPipeline::useProgramStages(pPVar6,2,dVar4);
    local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created pipeline ",0x14);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," with vertex program ",0x15);
    (**(code **)(paVar8->_M_allocated_capacity + 0x10))(paVar8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1," and fragment program ",0x16);
    (**(code **)(paVar11->_M_allocated_capacity + 0x10))(paVar11);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
    local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  }
  condition = glu::ProgramPipeline::isValid(local_268.m_data.ptr);
  local_1c0._0_8_ = local_1b0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1c0,"Pipeline is invalid after initialization","");
  tcu::ResultCollector::check(&this->m_status,condition,(string *)local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._0_8_ != local_1b0) {
    operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0]._M_allocated_capacity + 1));
  }
  paVar9 = paVar8;
  if ((this->m_params).switchVtx == true) {
    genVtxShaderSrc(&local_258,pp->vtxSeed,&local_1f8->vtxOutputs,&local_238,bVar3,pp->vtxScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1c0,this,SHADERTYPE_VERTEX,&local_258);
    uVar2 = local_1c0._0_8_;
    if ((paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_1c0._0_8_) &&
       (paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar2,
       paVar8 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0)) {
      (**(code **)(paVar8->_M_allocated_capacity + 8))(paVar8);
    }
    pPVar6 = local_268.m_data.ptr;
    dVar4 = (**(code **)(paVar9->_M_allocated_capacity + 0x10))(paVar9);
    glu::ProgramPipeline::useProgramStages(pPVar6,1,dVar4);
    local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Switched pipeline ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\'s vertex stage to single-shader program ",0x29);
    (**(code **)(paVar9->_M_allocated_capacity + 0x10))(paVar9);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  paVar8 = paVar11;
  if ((this->m_params).switchFrg == true) {
    genFrgShaderSrc(&local_258,pp->frgSeed,local_1f0,&local_218,bVar3,pp->frgScale);
    createSingleShaderProgram
              ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
                *)local_1c0,this,SHADERTYPE_FRAGMENT,&local_258);
    uVar2 = local_1c0._0_8_;
    if ((paVar11 !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_1c0._0_8_) &&
       (paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar2,
       paVar11 !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(paVar11->_M_allocated_capacity + 8))(paVar11);
    }
    pPVar6 = local_268.m_data.ptr;
    dVar4 = (**(code **)(paVar8->_M_allocated_capacity + 0x10))(paVar8);
    glu::ProgramPipeline::useProgramStages(pPVar6,2,dVar4);
    local_1c0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1c0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Switched pipeline ",0x15);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"\'s fragment stage to single-shader program ",0x2b);
    (**(code **)(paVar8->_M_allocated_capacity + 0x10))(paVar8);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258._M_dataplus._M_p != &local_258.field_2) {
      operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
    }
  }
  if (((this->m_params).switchVtx != false) || ((this->m_params).switchFrg == true)) {
    bVar3 = glu::ProgramPipeline::isValid(local_268.m_data.ptr);
    local_1c0._0_8_ = local_1b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1c0,"Pipeline became invalid after changing a stage\'s program","");
    tcu::ResultCollector::check(&this->m_status,bVar3,(string *)local_1c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c0._0_8_ != local_1b0) {
      operator_delete((void *)local_1c0._0_8_,(ulong)(local_1b0[0]._M_allocated_capacity + 1));
    }
  }
  if ((this->m_params).useUniform == true) {
    paVar11 = paVar9;
    if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      paVar11 = local_278;
    }
    setUniform(this,(ProgramWrapper *)&paVar11->_M_allocated_capacity,&local_238,pp->vtxScale,
               (this->m_params).useProgramUniform);
    paVar11 = paVar8;
    if (paVar8 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
      paVar11 = local_278;
    }
    setUniform(this,(ProgramWrapper *)&paVar11->_M_allocated_capacity,&local_218,pp->frgScale,
               (this->m_params).useProgramUniform);
  }
  else {
    tcu::TestLog::writeMessage
              (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
               "// Programs use constants instead of uniforms");
  }
  pPVar7 = (Pipeline *)operator_new(0x40);
  pPVar6 = local_268.m_data.ptr;
  local_268.m_data.ptr = (ProgramPipeline *)0x0;
  local_40.m_data.ptr = (ProgramPipeline *)0x0;
  (pPVar7->pipeline).
  super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>.m_data.ptr =
       pPVar6;
  (pPVar7->fullProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)local_278;
  (pPVar7->vtxProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)paVar9;
  (pPVar7->frgProg).
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
  .m_data.ptr = (ProgramWrapper *)paVar8;
  (local_1e8->
  super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ).m_data.ptr = pPVar7;
  de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::reset
            (&local_40);
  de::details::UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>::reset
            (&local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  paVar8 = &local_238.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != paVar8) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
    paVar8 = extraout_RAX;
  }
  return (MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *)paVar8;
}

Assistant:

MovePtr<Pipeline> SeparateShaderTest::createPipeline (const ProgramParams& pp)
{
	const bool		useUniform	= m_params.useUniform;
	const string	vtxName		= m_params.useSameName ? "scale" : "vtxScale";
	const deUint32	initVtxSeed	= m_params.switchVtx ? m_rnd.getUint32() : pp.vtxSeed;

	const string	frgName		= m_params.useSameName ? "scale" : "frgScale";
	const deUint32	initFrgSeed	= m_params.switchFrg ? m_rnd.getUint32() : pp.frgSeed;
	const string	frgSource	= genFrgShaderSrc(initFrgSeed, m_varyings.frgInputs,
												  frgName, useUniform, pp.frgScale);

	const RenderContext&		renderCtx	= getRenderContext();
	MovePtr<ProgramPipeline>	pipeline	(new ProgramPipeline(renderCtx));
	MovePtr<ProgramWrapper>		fullProg;
	MovePtr<ProgramWrapper>		vtxProg;
	MovePtr<ProgramWrapper>		frgProg;

	// We cannot allow a situation where we have a single program with a
	// single uniform, because then the vertex and fragment shader uniforms
	// would not be distinct in the final pipeline, and we are going to test
	// that altering one uniform will not affect the other.
	DE_ASSERT(!(m_params.initSingle	&& m_params.useSameName &&
				!m_params.switchVtx && !m_params.switchFrg));

	if (m_params.initSingle)
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed,
										   varyingCompatVtxOutputs(m_varyings),
										   vtxName, useUniform, pp.vtxScale);
		fullProg = createShaderProgram(&vtxSource, &frgSource, true);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT | GL_FRAGMENT_SHADER_BIT,
								   fullProg->getProgramName());
		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with two-shader program " << fullProg->getProgramName()
			  << TestLog::EndMessage;
	}
	else
	{
		string vtxSource = genVtxShaderSrc(initVtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, vtxSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());

		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, frgSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());

		log() << TestLog::Message
			  << "// Created pipeline " << pipeline->getPipeline()
			  << " with vertex program " << vtxProg->getProgramName()
			  << " and fragment program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	m_status.check(pipeline->isValid(),
				   "Pipeline is invalid after initialization");

	if (m_params.switchVtx)
	{
		string newSource = genVtxShaderSrc(pp.vtxSeed, m_varyings.vtxOutputs,
										   vtxName, useUniform, pp.vtxScale);
		vtxProg = createSingleShaderProgram(glu::SHADERTYPE_VERTEX, newSource);
		pipeline->useProgramStages(GL_VERTEX_SHADER_BIT, vtxProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s vertex stage to single-shader program " << vtxProg->getProgramName()
			  << TestLog::EndMessage;
	}
	if (m_params.switchFrg)
	{
		string newSource = genFrgShaderSrc(pp.frgSeed, m_varyings.frgInputs,
										   frgName, useUniform, pp.frgScale);
		frgProg = createSingleShaderProgram(glu::SHADERTYPE_FRAGMENT, newSource);
		pipeline->useProgramStages(GL_FRAGMENT_SHADER_BIT, frgProg->getProgramName());
		log() << TestLog::Message
			  << "// Switched pipeline " << pipeline->getPipeline()
			  << "'s fragment stage to single-shader program " << frgProg->getProgramName()
			  << TestLog::EndMessage;
	}

	if (m_params.switchVtx || m_params.switchFrg)
		m_status.check(pipeline->isValid(),
					   "Pipeline became invalid after changing a stage's program");

	if (m_params.useUniform)
	{
		ProgramWrapper& vtxStage = *(vtxProg ? vtxProg : fullProg);
		ProgramWrapper& frgStage = *(frgProg ? frgProg : fullProg);

		setUniform(vtxStage, vtxName, pp.vtxScale, m_params.useProgramUniform);
		setUniform(frgStage, frgName, pp.frgScale, m_params.useProgramUniform);
	}
	else
		log().writeMessage("// Programs use constants instead of uniforms");

	return MovePtr<Pipeline>(new Pipeline(pipeline, fullProg, vtxProg, frgProg));
}